

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ufiber.hpp
# Opt level: O0

type ufiber::spawn<boost::asio::io_context,main::__0&>
               (io_context *ctx,anon_class_8_1_a7c1402f_for_f_ *f)

{
  fiber_main<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_djarek[P]ufiber_tests_ufiber_yield_token_conversion_cpp:23:7),_boost::asio::io_context::basic_executor_type<std::allocator<void>,_0U>,_ufiber::broken_promise>
  local_38;
  fiber local_20;
  anon_class_8_1_a7c1402f_for_f_ *local_18;
  anon_class_8_1_a7c1402f_for_f_ *f_local;
  io_context *ctx_local;
  
  local_38.f_ = (anon_class_8_1_a7c1402f_for_f_)f->count;
  local_18 = f;
  f_local = (anon_class_8_1_a7c1402f_for_f_ *)ctx;
  boost::asio::io_context::get_executor((io_context *)&local_38.executor_);
  boost::context::fiber::
  fiber<ufiber::detail::fiber_main<main::__0,boost::asio::io_context::basic_executor_type<std::allocator<void>,0u>,ufiber::broken_promise>,void>
            (&local_20,&local_38);
  detail::initial_resume(&local_20);
  boost::context::fiber::~fiber(&local_20);
  detail::
  fiber_main<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/djarek[P]ufiber/tests/ufiber/yield_token_conversion.cpp:23:7),_boost::asio::io_context::basic_executor_type<std::allocator<void>,_0U>,_ufiber::broken_promise>
  ::~fiber_main(&local_38);
  return;
}

Assistant:

auto
spawn(Ctx& ctx, F&& f) -> typename std::enable_if<
  std::is_convertible<Ctx&, boost::asio::execution_context&>::value>::type
{
    detail::initial_resume(
      boost::context::fiber{detail::fiber_main<typename std::decay<F>::type,
                                               typename Ctx::executor_type>{
        std::forward<F>(f), ctx.get_executor()}});
}